

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::
     log<char_const(&)[62],capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [62],
               TestEnum_9c8e9318b29d9cd3 *params_1,TestEnum_9c8e9318b29d9cd3 *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  long lVar4;
  String argValues [3];
  String *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  String local_78 [3];
  
  str<char_const(&)[62]>
            (local_78,(kj *)params,(char (*) [62])CONCAT44(in_register_00000014,severity));
  capnp::_::enumString
            ((String *)&stack0xffffffffffffff68,*params_1,
             (RawBrandedSchema *)(capnp::schemas::s_9c8e9318b29d9cd3 + 0x48));
  capnp::_::enumString
            ((String *)&stack0xffffffffffffff68,*params_2,
             (RawBrandedSchema *)(capnp::schemas::s_9c8e9318b29d9cd3 + 0x48));
  argValues_00.size_ = in_stack_ffffffffffffff70;
  argValues_00.ptr = in_stack_ffffffffffffff68;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)local_78,argValues_00);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_78[0].content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_78[0].content.size_ + lVar4);
      *(undefined8 *)((long)&local_78[0].content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_78[0].content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_78[0].content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}